

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O3

FT_Bool tt_check_trickyness(FT_Face face)

{
  char *__haystack;
  code *pcVar1;
  FT_Stream stream;
  bool bVar2;
  byte bVar3;
  int iVar4;
  FT_Error FVar5;
  char *pcVar6;
  FT_ULong FVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int local_98 [26];
  
  if (face == (FT_Face)0x0) {
    return '\0';
  }
  __haystack = face->family_name;
  if (__haystack != (char *)0x0) {
    lVar10 = 0;
    do {
      pcVar6 = strstr(__haystack,&tt_check_trickyness_family_trick_names + lVar10);
      if (pcVar6 != (char *)0x0) {
        return '\x01';
      }
      lVar10 = lVar10 + 0x14;
    } while (lVar10 != 0x1cc);
  }
  local_98[0x14] = 0;
  local_98[0x15] = 0;
  local_98[0x16] = 0;
  local_98[0x17] = 0;
  local_98[0x10] = 0;
  local_98[0x11] = 0;
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0x18] = 0;
  local_98[0x19] = 0;
  uVar8 = (ulong)*(ushort *)&face[1].family_name;
  if (*(ushort *)&face[1].family_name == 0) {
    bVar2 = true;
  }
  else {
    uVar14 = 0;
    bVar2 = false;
    do {
      lVar12 = uVar14 * 0x20;
      lVar10 = *(long *)(face[1].style_name + lVar12);
      if (lVar10 == 0x63767420) {
        bVar2 = true;
        iVar9 = 0;
LAB_001733f1:
        lVar10 = 0;
        uVar8 = 0;
        do {
          if (*(long *)(face[1].style_name + lVar12 + 0x18) ==
              *(long *)(tt_check_trickyness_sfnt_ids_sfnt_id +
                       (ulong)(uint)(iVar9 << 4) + 8 + lVar10 * 0x30)) {
            if (uVar8 == 0) {
              pcVar1 = (code *)face[3].generic.data;
              if (pcVar1 == (code *)0x0) {
                uVar8 = 0;
              }
              else {
                iVar4 = (*pcVar1)(face,*(undefined8 *)(face[1].style_name + lVar12),face->stream,0);
                uVar8 = 0;
                if (iVar4 == 0) {
                  stream = face->stream;
                  uVar8 = *(ulong *)(face[1].style_name + lVar12 + 0x18);
                  FVar5 = FT_Stream_EnterFrame(stream,uVar8);
                  if (FVar5 == 0) {
                    uVar13 = 0;
                    if (3 < uVar8) {
                      uVar13 = 0;
                      do {
                        FVar7 = FT_Stream_GetULong(stream);
                        uVar13 = uVar13 + (int)FVar7;
                        uVar8 = uVar8 - 4;
                      } while (3 < uVar8);
                    }
                    if (uVar8 != 0) {
                      bVar11 = 0x18;
                      do {
                        bVar3 = FT_Stream_GetChar(stream);
                        uVar13 = uVar13 + ((uint)bVar3 << (bVar11 & 0x1f));
                        bVar11 = bVar11 - 8;
                        uVar8 = uVar8 - 1;
                      } while (uVar8 != 0);
                    }
                    FT_Stream_ExitFrame(stream);
                    uVar8 = (ulong)uVar13;
                  }
                  else {
                    uVar8 = 0;
                  }
                }
              }
            }
            iVar4 = local_98[lVar10];
            if (*(ulong *)(tt_check_trickyness_sfnt_ids_sfnt_id +
                          (ulong)(uint)(iVar9 << 4) + lVar10 * 0x30) == uVar8) {
              iVar4 = iVar4 + 1;
              local_98[lVar10] = iVar4;
            }
            if (iVar4 == 3) {
              return '\x01';
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x1a);
        uVar8 = (ulong)*(ushort *)&face[1].family_name;
      }
      else {
        if (lVar10 == 0x70726570) {
          iVar9 = 2;
          goto LAB_001733f1;
        }
        if (lVar10 == 0x6670676d) {
          iVar9 = 1;
          goto LAB_001733f1;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar8);
    bVar2 = !bVar2;
  }
  uVar8 = 0xfffffffffffffff3;
  while( true ) {
    iVar9 = local_98[uVar8 + 0xd];
    if ((bool)(uVar8 < 0xc & bVar2)) {
      iVar9 = iVar9 + 1;
      local_98[uVar8 + 0xd] = iVar9;
    }
    if (iVar9 == 3) break;
    uVar8 = uVar8 + 1;
    if (uVar8 == 0xd) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

static FT_Bool
  tt_check_trickyness( FT_Face  face )
  {
    if ( !face )
      return FALSE;

    /* For first, check the face name for quick check. */
    if ( face->family_name                               &&
         tt_check_trickyness_family( face->family_name ) )
      return TRUE;

    /* Type42 fonts may lack `name' tables, we thus try to identify */
    /* tricky fonts by checking the checksums of Type42-persistent  */
    /* sfnt tables (`cvt', `fpgm', and `prep').                     */
    if ( tt_check_trickyness_sfnt_ids( (TT_Face)face ) )
      return TRUE;

    return FALSE;
  }